

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O1

void __thiscall QGridLayout::maximumSize(QGridLayout *this)

{
  maximumSize((QGridLayout *)&this[-1].super_QLayout.super_QLayoutItem);
  return;
}

Assistant:

QSize QGridLayout::maximumSize() const
{
    Q_D(const QGridLayout);

    QSize s = d->maximumSize(horizontalSpacing(), verticalSpacing());
    int left, top, right, bottom;
    d->effectiveMargins(&left, &top, &right, &bottom);
    s += QSize(left + right, top + bottom);
    s = s.boundedTo(QSize(QLAYOUTSIZE_MAX, QLAYOUTSIZE_MAX));
    if (alignment() & Qt::AlignHorizontal_Mask)
        s.setWidth(QLAYOUTSIZE_MAX);
    if (alignment() & Qt::AlignVertical_Mask)
        s.setHeight(QLAYOUTSIZE_MAX);
    return s;
}